

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_shell.c
# Opt level: O1

int main(void)

{
  nsh_status_t status;
  nsh_t nsh;
  nsh_status_t local_bac;
  nsh_t local_ba8;
  
  enableRawMode();
  local_bac = NSH_STATUS_OK;
  nsh_init(&local_ba8,&local_bac);
  nsh_register_command(&local_ba8,"null",(nsh_cmd_handler_t *)0x0);
  nsh_run(&local_ba8);
  return 0;
}

Assistant:

int main(void)
{
    enableRawMode();
    // setvbuf(stdin, NULL, _IONBF, 0);
    // setvbuf(stdout, NULL, _IONBF, 0);
    nsh_status_t status = NSH_STATUS_OK;
    nsh_t nsh = nsh_init(&status);            // status intentionally ignored
    nsh_register_command(&nsh, "null", NULL); // NSH_NON_NULL precondition not satisfied
    nsh_run(&nsh);
    return 0;
}